

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeSetNonlinear(void *arkode_mem)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x177;
  }
  else if (*(int *)((long)arkode_mem + 0x110) == 0) {
    msgfmt = "time-stepping module does not require an algebraic solver";
    iVar2 = -0x30;
    error_code = -0x30;
    iVar1 = 0x180;
  }
  else {
    if (*(code **)((long)arkode_mem + 0x160) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0x160))();
      return iVar1;
    }
    msgfmt = "time-stepping module does not support this function";
    iVar2 = -0x30;
    error_code = -0x30;
    iVar1 = 0x18c;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetNonlinear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int ARKodeSetNonlinear(void* arkode_mem)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Call stepper routine (if provided) */
  if (ark_mem->step_setnonlinear)
  {
    return (ark_mem->step_setnonlinear(arkode_mem));
  }
  else
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__,
                    "time-stepping module does not support this function");
    return (ARK_STEPPER_UNSUPPORTED);
  }
}